

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

void __thiscall
particleSamples::filter_particles
          (particleSamples *this,int PoI_monval,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *full_list,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *filted_list)

{
  pointer *pppvVar1;
  pointer ppvVar2;
  iterator __position;
  pointer paVar3;
  vector<particle_info,std::allocator<particle_info>> *this_00;
  undefined4 uVar4;
  bool bVar5;
  long lVar6;
  anon_struct_120_15_f999644b *paVar7;
  iterator __position_00;
  anon_struct_120_15_f999644b *part_i;
  pointer ppvVar8;
  pointer __args;
  long lVar9;
  byte bVar10;
  vector<particle_info,_std::allocator<particle_info>_> *local_38;
  
  bVar10 = 0;
  clear_out_previous_record(this,filted_list);
  ppvVar8 = (full_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppvVar2 = (full_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppvVar8 != ppvVar2) {
    lVar9 = 0;
    do {
      local_38 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
      (local_38->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           (filted_list->
           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (filted_list->
          super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  ((vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                    *)filted_list,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppvVar1 = &(filted_list->
                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      paVar3 = ((*ppvVar8)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (__args = ((*ppvVar8)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                    _M_impl.super__Vector_impl_data._M_start; __args != paVar3; __args = __args + 1)
      {
        bVar5 = decide_to_pick_OSCAR(this,PoI_monval,__args->monval);
        if (bVar5) {
          this_00 = (vector<particle_info,std::allocator<particle_info>> *)
                    (filted_list->
                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar9];
          __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_00 + 8);
          if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_00 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(this_00,__position_00,__args);
          }
          else {
            paVar7 = __args;
            for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
              uVar4 = *(undefined4 *)&paVar7->field_0x4;
              (__position_00._M_current)->monval = paVar7->monval;
              *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar4;
              paVar7 = (anon_struct_120_15_f999644b *)((long)paVar7 + (ulong)bVar10 * -0x10 + 8);
              __position_00._M_current = __position_00._M_current + (ulong)bVar10 * -0x10 + 8;
            }
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x78;
          }
        }
      }
      lVar9 = lVar9 + 1;
      ppvVar8 = ppvVar8 + 1;
    } while (ppvVar8 != ppvVar2);
  }
  return;
}

Assistant:

void particleSamples::filter_particles(
    const int PoI_monval, vector<vector<particle_info> *> *full_list,
    vector<vector<particle_info> *> *filted_list) {
    // clean out the previous record
    clear_out_previous_record(filted_list);

    int i = 0;
    for (auto &ev_i : (*full_list)) {
        filted_list->push_back(new vector<particle_info>);
        for (auto &part_i : (*ev_i)) {
            bool pick_flag = decide_to_pick_OSCAR(PoI_monval, part_i.monval);
            if (pick_flag) {
                (*filted_list)[i]->push_back(part_i);
            }
        }
        i++;
    }
}